

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::GetTextureSubImage::Errors::iterate(Errors *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ContextType ctxType;
  char *description;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*this->m_context->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (this->m_context->m_contextInfo,"GL_ARB_get_texture_sub_image");
  if ((bVar1) || (bVar2)) {
    prepare(this);
    bVar1 = testExistingTextureObjectError(this);
    bVar2 = testBufferOrMultisampledTargetError(this);
    bVar3 = testNegativeOffsetError(this);
    bVar4 = testBoundsError(this);
    bVar5 = testOneDimmensionalTextureErrors(this);
    bVar6 = testTwoDimmensionalTextureErrors(this);
    bVar7 = testBufferSizeError(this);
    bVar1 = ((bVar5 && bVar6) && bVar7) && ((bVar3 && bVar4) && (bVar1 && bVar2));
  }
  else {
    bVar1 = true;
  }
  clean(this);
  if (!bVar1) {
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar1,description
            );
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl4cts::GetTextureSubImage::Errors::iterate(void)
{
	bool is_ok		= true;
	bool test_error = false;

	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_get_texture_sub_image = m_context.getContextInfo().isExtensionSupported("GL_ARB_get_texture_sub_image");

	try
	{
		if (is_at_least_gl_45 || is_arb_get_texture_sub_image)
		{
			/* Prepare texture objects */
			prepare();

			/* Do tests. */
			is_ok &= testExistingTextureObjectError();

			is_ok &= testBufferOrMultisampledTargetError();

			is_ok &= testNegativeOffsetError();

			is_ok &= testBoundsError();

			is_ok &= testOneDimmensionalTextureErrors();

			is_ok &= testTwoDimmensionalTextureErrors();

			is_ok &= testBufferSizeError();
		}
	}
	catch (...)
	{
		is_ok	  = false;
		test_error = true;
	}

	/* Clean up */
	clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}